

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<DeclareStatementAstNode>_> * __thiscall
Parser::parseDeclareStatement
          (optional<std::shared_ptr<DeclareStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TokenType type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_c0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  undefined1 local_a0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  ostream *local_80;
  size_type __dnew_3;
  shared_ptr<Token> identifier;
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  undefined6 local_40;
  undefined2 uStack_3a;
  undefined6 uStack_38;
  undefined1 local_32;
  byte local_29;
  bool error;
  
  local_29 = 0;
  local_40 = 0x746365707845;
  uStack_3a = 0x6465;
  uStack_38 = 0x726176206120;
  local_32 = 0;
  type = (TokenType)this;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = &local_40;
  expect((Parser *)local_c0,type,(bool *)0x11,(string *)&local_29);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  if ((undefined6 *)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != &local_40) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,CONCAT26(uStack_3a,local_40) + 1);
  }
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2d;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = &local_40;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,
                  (ulong)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  local_40 = SUB86(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,0);
  uStack_3a = (undefined2)
              ((ulong)identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi >> 0x30);
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected whitespace following var declaration",0x2d);
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
           (long)identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
       = '\0';
  expect((Parser *)(local_c0 + 0x10),type,(bool *)0x4,(string *)&local_29);
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if ((undefined6 *)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != &local_40) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,CONCAT26(uStack_3a,local_40) + 1);
  }
  skipWhiteSpace(this);
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x30;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = &local_40;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,
                  (ulong)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  local_40 = SUB86(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,0);
  uStack_3a = (undefined2)
              ((ulong)identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi >> 0x30);
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected an identifier following var declaration",0x30);
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
           (long)identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
       = '\0';
  expect((Parser *)&__dnew_3,type,(bool *)0x18,(string *)&local_29);
  if ((undefined6 *)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != &local_40) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,CONCAT26(uStack_3a,local_40) + 1);
  }
  skipWhiteSpace(this);
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2c;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = &local_40;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,
                  (ulong)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  local_40 = SUB86(identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,0);
  uStack_3a = (undefined2)
              ((ulong)identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi >> 0x30);
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected an equals following var declaration",0x2c);
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
           (long)identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
       = '\0';
  expect((Parser *)local_a0,type,(bool *)0x12,(string *)&local_29);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if ((undefined6 *)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != &local_40) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,CONCAT26(uStack_3a,local_40) + 1);
  }
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)
                  &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this
                 );
  local_80 = (ostream *)0x3c;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = &local_40;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,(ulong)&local_80);
  local_40 = SUB86(local_80,0);
  uStack_3a = (undefined2)((ulong)local_80 >> 0x30);
  builtin_strncpy((char *)expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected a semicolon following expression of var declaration",0x3c);
  *(char *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
           (long)local_80) = '\0';
  expect((Parser *)(local_a0 + 0x10),type,(bool *)0x10,(string *)&local_29);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if ((undefined6 *)
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != &local_40) {
    operator_delete((void *)expression.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,CONCAT26(uStack_3a,local_40) + 1);
  }
  bVar1 = false;
  if ((local_29 == 0) && (bVar1 = false, __dnew_3 != 0)) {
    local_29 = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
               _M_payload.
               super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
               super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ ^
               1;
    if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01'
       ) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
      p_Var2->_M_use_count = 1;
      p_Var2->_M_weak_count = 1;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fbe8;
      __gnu_cxx::new_allocator<DeclareStatementAstNode>::
      construct<DeclareStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
                ((new_allocator<DeclareStatementAstNode> *)
                 &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
                 (DeclareStatementAstNode *)(p_Var2 + 1),(shared_ptr<Token> *)&__dnew_3,
                 (shared_ptr<ExpressionAstNode> *)
                 &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<DeclareStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<DeclareStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<DeclareStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (DeclareStatementAstNode *)(p_Var2 + 1);
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<DeclareStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<DeclareStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<DeclareStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var2;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<DeclareStatementAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<DeclareStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<DeclareStatementAstNode>_>._M_engaged = bVar1;
  if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
  {
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
    if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value.
        super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<DeclareStatementAstNode>>
Parser::parseDeclareStatement() noexcept {
  bool error = false;

  this->expect(TokenType::Var, error, "Expected a var");

  this->expect(TokenType::WhiteSpace, error, "Expected whitespace following var declaration");

  this->skipWhiteSpace();

  auto identifier = this->expect(TokenType::Identifier, error,
    "Expected an identifier following var declaration");

  this->skipWhiteSpace();

  this->expect(TokenType::Assign, error, "Expected an equals following var declaration");

  auto expression = this->parseExpression();

  this->expect(TokenType::SemiColon, error,
    "Expected a semicolon following expression of var declaration");

  error = error || !identifier || !expression;

  if (error) { return std::nullopt; }

  return std::make_shared<DeclareStatementAstNode>(identifier, expression.value());
}